

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O1

bool pybind11::detail::npy_format_descriptor<sdf_tools::int3,_void>::direct_converter
               (PyObject *obj,void **value)

{
  _func_bool_PyObject_ptr_PyObject_ptr *p_Var1;
  bool bVar2;
  int iVar3;
  npy_api *pnVar4;
  PyObject *pPVar5;
  object descr;
  object local_20;
  
  pnVar4 = npy_api::get();
  if ((obj->ob_type != pnVar4->PyVoidArrType_Type_) && (iVar3 = PyType_IsSubtype(), iVar3 == 0)) {
    return false;
  }
  local_20.super_handle.m_ptr = (handle)(*pnVar4->PyArray_DescrFromScalar_)(obj);
  if (local_20.super_handle.m_ptr != (PyObject *)0x0) {
    p_Var1 = pnVar4->PyArray_EquivTypes_;
    pPVar5 = dtype_ptr();
    bVar2 = (*p_Var1)(pPVar5,(PyObject *)local_20.super_handle.m_ptr);
    if (bVar2) {
      *value = obj[1].ob_type;
      bVar2 = true;
      goto LAB_00139835;
    }
  }
  bVar2 = false;
LAB_00139835:
  object::~object(&local_20);
  return bVar2;
}

Assistant:

static bool direct_converter(PyObject *obj, void*& value) {
        auto& api = npy_api::get();
        if (!PyObject_TypeCheck(obj, api.PyVoidArrType_Type_))
            return false;
        if (auto descr = reinterpret_steal<object>(api.PyArray_DescrFromScalar_(obj))) {
            if (api.PyArray_EquivTypes_(dtype_ptr(), descr.ptr())) {
                value = ((PyVoidScalarObject_Proxy *) obj)->obval;
                return true;
            }
        }
        return false;
    }